

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayproperty.cpp
# Opt level: O0

Value * __thiscall
camp::ArrayProperty::get
          (Value *__return_storage_ptr__,ArrayProperty *this,UserObject *object,size_t index)

{
  bool bVar1;
  ForbiddenRead *__return_storage_ptr___00;
  string *propertyName;
  OutOfRange *__return_storage_ptr___01;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  OutOfRange local_120;
  size_t local_d8;
  size_t range;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [48];
  ForbiddenRead local_70;
  size_t local_28;
  size_t index_local;
  UserObject *object_local;
  ArrayProperty *this_local;
  
  local_28 = index;
  index_local = (size_t)object;
  object_local = (UserObject *)this;
  this_local = (ArrayProperty *)__return_storage_ptr__;
  bVar1 = Property::readable(&this->super_Property,object);
  if (!bVar1) {
    range._6_1_ = 1;
    __return_storage_ptr___00 = (ForbiddenRead *)__cxa_allocate_exception(0x48);
    propertyName = Property::name_abi_cxx11_(&this->super_Property);
    ForbiddenRead::ForbiddenRead(&local_70,propertyName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c8,"Value camp::ArrayProperty::get(const UserObject &, std::size_t) const",
               (allocator *)((long)&range + 7));
    Error::prepare<camp::ForbiddenRead>
              (__return_storage_ptr___00,&local_70,(string *)local_a0,0x5c,(string *)local_c8);
    range._6_1_ = 0;
    __cxa_throw(__return_storage_ptr___00,&ForbiddenRead::typeinfo,ForbiddenRead::~ForbiddenRead);
  }
  local_d8 = size(this,(UserObject *)index_local);
  if (local_d8 <= local_28) {
    __return_storage_ptr___01 = (OutOfRange *)__cxa_allocate_exception(0x48);
    OutOfRange::OutOfRange(&local_120,local_28,local_d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_140,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_168,"Value camp::ArrayProperty::get(const UserObject &, std::size_t) const",
               &local_169);
    Error::prepare<camp::OutOfRange>
              (__return_storage_ptr___01,&local_120,(string *)local_140,0x61,(string *)local_168);
    __cxa_throw(__return_storage_ptr___01,&OutOfRange::typeinfo,OutOfRange::~OutOfRange);
  }
  (*(this->super_Property).super_TagHolder._vptr_TagHolder[9])
            (__return_storage_ptr__,this,index_local,local_28);
  return __return_storage_ptr__;
}

Assistant:

Value ArrayProperty::get(const UserObject& object, std::size_t index) const
{
    // Check if the property is readable
    if (!readable(object))
        CAMP_ERROR(ForbiddenRead(name()));

    // Make sure that the index is not out of range
    std::size_t range = size(object);
    if (index >= range)
        CAMP_ERROR(OutOfRange(index, range));

    return getElement(object, index);
}